

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O1

void __thiscall
HVectorBase<double>::saxpy<HighsCDouble,double>
          (HVectorBase<double> *this,HighsCDouble pivotX,HVectorBase<double> *pivot)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer pdVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  HighsCDouble HVar14;
  HighsCDouble local_40;
  
  local_40.lo = pivotX.lo;
  local_40.hi = pivotX.hi;
  iVar9 = this->count;
  iVar2 = pivot->count;
  if (0 < (long)iVar2) {
    piVar4 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (pivot->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (pivot->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      iVar3 = piVar6[lVar10];
      dVar1 = pdVar5[iVar3];
      HVar14 = HighsCDouble::operator*(&local_40,pdVar7[iVar3]);
      dVar12 = HVar14.hi;
      if ((dVar1 == 0.0) && (!NAN(dVar1))) {
        lVar8 = (long)iVar9;
        iVar9 = iVar9 + 1;
        piVar4[lVar8] = iVar3;
      }
      dVar13 = dVar1 + dVar12;
      dVar13 = HVar14.lo + (dVar1 - (dVar13 - dVar12)) + (dVar12 - (dVar13 - (dVar13 - dVar12))) +
               dVar13;
      uVar11 = -(ulong)(ABS(dVar13) < 1e-14);
      pdVar5[iVar3] = (double)(~uVar11 & (ulong)dVar13 | uVar11 & 0x358dee7a4ad4b81f);
      lVar10 = lVar10 + 1;
    } while (iVar2 != lVar10);
  }
  this->count = iVar9;
  return;
}

Assistant:

void HVectorBase<Real>::saxpy(const RealPivX pivotX,
                              const HVectorBase<RealPiv>* pivot) {
  /*
   * Add a multiple pivotX of *pivot into this vector, maintaining
   * indices of nonzeros but not tracking cancellation.
   * The real types may all be different but must mix in operations and be
   * convertible to this HVector's real type.
   */
  HighsInt workCount = count;
  HighsInt* workIndex = &index[0];
  Real* workArray = &array[0];

  const HighsInt pivotCount = pivot->count;
  const HighsInt* pivotIndex = &pivot->index[0];
  const RealPiv* pivotArray = &pivot->array[0];

  using std::abs;
  for (HighsInt k = 0; k < pivotCount; k++) {
    const HighsInt iRow = pivotIndex[k];
    const Real x0 = workArray[iRow];
    const Real x1 = Real(x0 + pivotX * pivotArray[iRow]);
    if (x0 == Real{0}) workIndex[workCount++] = iRow;
    workArray[iRow] = (abs(x1) < kHighsTiny) ? kHighsZero : x1;
  }
  count = workCount;
}